

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void __thiscall ncnn::Mat::substract_mean_normalize(Mat *this,float *mean_vals,float *norm_vals)

{
  float fVar1;
  Layer *pLVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  Mat MStack_9e8;
  Mat weights [1];
  Mat local_968;
  Option opt;
  
  if (norm_vals == (float *)0x0 && mean_vals != (float *)0x0) {
    pLVar2 = create_layer(3);
    ParamDict::ParamDict((ParamDict *)&opt);
    ParamDict::set((ParamDict *)&opt,0,this->c);
    (*pLVar2->_vptr_Layer[2])(pLVar2,&opt);
    weights[0].elemsize._0_4_ = 0;
    weights[0]._20_8_ = 0;
    weights[0].data = (void *)0x0;
    weights[0].refcount._0_4_ = 0;
    weights[0].refcount._4_4_ = 0;
    weights[0].allocator = (Allocator *)0x0;
    weights[0].dims = 0;
    weights[0].w = 0;
    weights[0].h = 0;
    weights[0].c = 0;
    weights[0].cstep = 0;
    Mat(&MStack_9e8,this->c,4,(Allocator *)0x0);
    operator=(weights,&MStack_9e8);
    ~Mat(&MStack_9e8);
    uVar4 = 0;
    uVar3 = (ulong)(uint)this->c;
    if (this->c < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      *(float *)((long)weights[0].data + uVar4 * 4) = -mean_vals[uVar4];
    }
    ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&MStack_9e8,weights);
    (*pLVar2->_vptr_Layer[3])(pLVar2,&MStack_9e8);
  }
  else {
    if (mean_vals != (float *)0x0 || norm_vals == (float *)0x0) {
      if (mean_vals == (float *)0x0 || norm_vals == (float *)0x0) {
        return;
      }
      pLVar2 = create_layer(0x1d);
      ParamDict::ParamDict((ParamDict *)&opt);
      ParamDict::set((ParamDict *)&opt,0,this->c);
      ParamDict::set((ParamDict *)&opt,1,1);
      (*pLVar2->_vptr_Layer[2])(pLVar2,&opt);
      weights[0].elemsize._0_4_ = 0;
      weights[0]._20_8_ = 0;
      weights[0].data = (void *)0x0;
      weights[0].refcount._0_4_ = 0;
      weights[0].refcount._4_4_ = 0;
      local_968.allocator = (Allocator *)0x0;
      local_968.dims = 0;
      local_968.w = 0;
      local_968.h = 0;
      local_968.c = 0;
      local_968.cstep = 0;
      weights[0].allocator = (Allocator *)0x0;
      weights[0].dims = 0;
      weights[0].w = 0;
      weights[0].h = 0;
      weights[0].c = 0;
      weights[0].cstep = 0;
      local_968.data = (void *)0x0;
      local_968.refcount._0_4_ = 0;
      local_968.refcount._4_4_ = 0;
      local_968.elemsize._0_4_ = 0;
      local_968._20_8_ = 0;
      Mat(&MStack_9e8,this->c,4,(Allocator *)0x0);
      operator=(weights,&MStack_9e8);
      ~Mat(&MStack_9e8);
      Mat(&MStack_9e8,this->c,4,(Allocator *)0x0);
      operator=(&local_968,&MStack_9e8);
      ~Mat(&MStack_9e8);
      uVar4 = 0;
      uVar3 = (ulong)(uint)this->c;
      if (this->c < 1) {
        uVar3 = uVar4;
      }
      for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        fVar1 = norm_vals[uVar4];
        *(float *)((long)weights[0].data + uVar4 * 4) = fVar1;
        *(float *)((long)local_968.data + uVar4 * 4) = -mean_vals[uVar4] * fVar1;
      }
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&MStack_9e8,weights);
      (*pLVar2->_vptr_Layer[3])(pLVar2,&MStack_9e8);
      ModelBin::~ModelBin((ModelBin *)&MStack_9e8);
      lVar5 = 0x40;
      do {
        ~Mat((Mat *)((long)&weights[0].data + lVar5));
        lVar5 = lVar5 + -0x40;
      } while (lVar5 != -0x40);
      goto LAB_001182ca;
    }
    pLVar2 = create_layer(0x1d);
    ParamDict::ParamDict((ParamDict *)&opt);
    ParamDict::set((ParamDict *)&opt,0,this->c);
    (*pLVar2->_vptr_Layer[2])(pLVar2,&opt);
    weights[0].elemsize._0_4_ = 0;
    weights[0]._20_8_ = 0;
    weights[0].data = (void *)0x0;
    weights[0].refcount._0_4_ = 0;
    weights[0].refcount._4_4_ = 0;
    weights[0].allocator = (Allocator *)0x0;
    weights[0].dims = 0;
    weights[0].w = 0;
    weights[0].h = 0;
    weights[0].c = 0;
    weights[0].cstep = 0;
    Mat(&MStack_9e8,this->c,4,(Allocator *)0x0);
    operator=(weights,&MStack_9e8);
    ~Mat(&MStack_9e8);
    uVar4 = 0;
    uVar3 = (ulong)(uint)this->c;
    if (this->c < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      *(float *)((long)weights[0].data + uVar4 * 4) = norm_vals[uVar4];
    }
    ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&MStack_9e8,weights);
    (*pLVar2->_vptr_Layer[3])(pLVar2,&MStack_9e8);
  }
  ModelBin::~ModelBin((ModelBin *)&MStack_9e8);
  ~Mat(weights);
LAB_001182ca:
  ParamDict::~ParamDict((ParamDict *)&opt);
  Option::Option(&opt);
  opt.num_threads = 1;
  (*pLVar2->_vptr_Layer[4])(pLVar2,&opt);
  (*pLVar2->_vptr_Layer[9])(pLVar2,this,&opt);
  (*pLVar2->_vptr_Layer[5])(pLVar2,&opt);
  (*pLVar2->_vptr_Layer[1])(pLVar2);
  return;
}

Assistant:

void Mat::substract_mean_normalize(const float* mean_vals, const float* norm_vals)
{
    Layer* op;

    if (mean_vals && !norm_vals)
    {
        // substract mean only
        op = create_layer(LayerType::Bias);

        ParamDict pd;
        pd.set(0, c);

        op->load_param(pd);

        Mat weights[1];
        weights[0] = Mat(c);
        for (int q=0; q<c; q++)
        {
            weights[0][q] = -mean_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else if (!mean_vals && norm_vals)
    {
        // normalize only
        op = create_layer(LayerType::Scale);

        ParamDict pd;
        pd.set(0, c);

        op->load_param(pd);

        Mat weights[1];
        weights[0] = Mat(c);
        for (int q=0; q<c; q++)
        {
            weights[0][q] = norm_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else if (mean_vals && norm_vals)
    {
        // substract mean and normalize
        op = create_layer(LayerType::Scale);

        ParamDict pd;
        pd.set(0, c);
        pd.set(1, 1);

        op->load_param(pd);

        Mat weights[2];
        weights[0] = Mat(c);
        weights[1] = Mat(c);
        for (int q=0; q<c; q++)
        {
            weights[0][q] = norm_vals[q];
            weights[1][q] = - mean_vals[q] * norm_vals[q];
        }

        op->load_model(ModelBinFromMatArray(weights));
    }
    else // if (!mean_vals && !norm_vals)
    {
        return;
    }

    Option opt;
    opt.num_threads = 1;// TODO

    op->create_pipeline(opt);

    op->forward_inplace(*this, opt);

    op->destroy_pipeline(opt);

    delete op;
}